

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_cross_entropy_loss(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  ggml_type in_stack_ffffffffffffffdc;
  ggml_context *in_stack_ffffffffffffffe0;
  
  _Var1 = ggml_are_same_shape(in_RSI,in_RDX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x13eb,"GGML_ASSERT(%s) failed","ggml_are_same_shape(a, b)");
  }
  pgVar2 = ggml_new_tensor_1d(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,0x1540ad);
  pgVar2->op = GGML_OP_CROSS_ENTROPY_LOSS;
  pgVar2->src[0] = in_RSI;
  pgVar2->src[1] = in_RDX;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_cross_entropy_loss(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, a->type, 1);

    result->op     = GGML_OP_CROSS_ENTROPY_LOSS;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}